

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall
soul::StructuralParser::parseEndpoint
          (StructuralParser *this,ProcessorBase *p,bool isInput,EndpointType endpointType)

{
  Allocator *pAVar1;
  bool bVar2;
  EndpointDeclaration *pEVar3;
  EndpointDetails *pEVar4;
  vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
  *pvVar5;
  EndpointDetails *pEVar6;
  pool_ref<soul::AST::EndpointDeclaration> local_b0;
  Context local_a8;
  EndpointDeclaration *local_90;
  EndpointDeclaration *e;
  pool_ref<soul::AST::EndpointDeclaration> local_80;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> local_78;
  Context local_40;
  EndpointDeclaration *local_28;
  EndpointDeclaration *first;
  EndpointType endpointType_local;
  bool isInput_local;
  ProcessorBase *p_local;
  StructuralParser *this_local;
  
  pAVar1 = this->allocator;
  first._0_4_ = endpointType;
  first._7_1_ = isInput;
  _endpointType_local = p;
  p_local = (ProcessorBase *)this;
  getContext(&local_40,this);
  pEVar3 = allocate<soul::AST::EndpointDeclaration,soul::AST::Allocator&,soul::AST::Context,bool&,soul::EndpointType&>
                     (this,pAVar1,&local_40,(bool *)((long)&first + 7),(EndpointType *)&first);
  AST::Context::~Context(&local_40);
  local_28 = pEVar3;
  parseEndpointTypeList(&local_78,this,(EndpointType)first);
  pEVar4 = AST::EndpointDeclaration::getDetails(local_28);
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::operator=
            (&pEVar4->dataTypes,&local_78);
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::~ArrayWithPreallocation
            (&local_78);
  parseInputOrOutputName(this,local_28);
  pvVar5 = &_endpointType_local->endpoints;
  pool_ref<soul::AST::EndpointDeclaration>::pool_ref<soul::AST::EndpointDeclaration,void>
            (&local_80,local_28);
  std::
  vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
  ::push_back(pvVar5,&local_80);
  pool_ref<soul::AST::EndpointDeclaration>::~pool_ref(&local_80);
  while( true ) {
    e = (EndpointDeclaration *)anon_var_dwarf_10ee90;
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)",");
    if (!bVar2) break;
    pAVar1 = this->allocator;
    getContext(&local_a8,this);
    pEVar3 = allocate<soul::AST::EndpointDeclaration,soul::AST::Allocator&,soul::AST::Context,bool&,soul::EndpointType&>
                       (this,pAVar1,&local_a8,(bool *)((long)&first + 7),(EndpointType *)&first);
    AST::Context::~Context(&local_a8);
    local_90 = pEVar3;
    pEVar4 = AST::EndpointDeclaration::getDetails(local_28);
    pEVar6 = AST::EndpointDeclaration::getDetails(local_90);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::operator=
              (&pEVar6->dataTypes,&pEVar4->dataTypes);
    parseInputOrOutputName(this,local_90);
    pvVar5 = &_endpointType_local->endpoints;
    pool_ref<soul::AST::EndpointDeclaration>::pool_ref<soul::AST::EndpointDeclaration,void>
              (&local_b0,local_90);
    std::
    vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
    ::push_back(pvVar5,&local_b0);
    pool_ref<soul::AST::EndpointDeclaration>::~pool_ref(&local_b0);
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54c9e0);
  return;
}

Assistant:

void parseEndpoint (AST::ProcessorBase& p, bool isInput, EndpointType endpointType)
    {
        auto& first = allocate<AST::EndpointDeclaration> (allocator, getContext(), isInput, endpointType);
        first.getDetails().dataTypes = parseEndpointTypeList (endpointType);
        parseInputOrOutputName (first);
        p.endpoints.push_back (first);

        while (matchIf (Operator::comma))
        {
            auto& e = allocate<AST::EndpointDeclaration> (allocator, getContext(), isInput, endpointType);
            e.getDetails().dataTypes = first.getDetails().dataTypes;
            parseInputOrOutputName (e);
            p.endpoints.push_back (e);
        }

        expect (Operator::semicolon);
    }